

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(void)

{
  uint address;
  byte bVar1;
  short sVar2;
  
  system_init();
  sVar2 = 0x2134;
  do {
    address = pc;
    pc = pc + 1;
    bVar1 = getbyte(address);
    (*decode[bVar1])();
    if ((sVar2 == 0) && (sVar2 = 1, intd_f == '\0')) {
      gen_irq();
      sVar2 = 0x2134;
    }
    sVar2 = sVar2 + -1;
  } while( true );
}

Assistant:

int main() {
    uint clock;                                // local clock counter
    ubyte ir = 0;                                // holds current instruction

    system_init();                   // initialise everything.

    for (clock = CLKFREQ; ; clock--)        // interrupt generation timer
    {
        ir = getbyte(pc++);                // fetch instruction
        decode[ir]();              // decode and execute the instructon

        //show_regs();

        if (!clock)                // if an interrupt is due
        {
            if (!intd_f)            // and if interrupts are enabled,
            {
                gen_irq();              // call the interrupt  handler
                clock = CLKFREQ;          // and reset interrupt generation timer
            }
            else(clock++);          // if interrupts are disabled,
            // increment the clock timer so that
            // an interrupt occurs when enabled
        }
    }
}